

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonIO.hh
# Opt level: O2

void __thiscall avro::json::JsonGenerator::objectStart(JsonGenerator *this)

{
  size_t in_RCX;
  void *__buf;
  
  sep(this);
  std::deque<avro::json::JsonGenerator::State,_std::allocator<avro::json::JsonGenerator::State>_>::
  push_back(&(this->stateStack).c,&this->top);
  this->top = stMap0;
  StreamWriter::write(&this->out_,0x7b,__buf,in_RCX);
  return;
}

Assistant:

void objectStart() {
        sep();
        stateStack.push(top);
        top = stMap0;
        out_.write('{');
    }